

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::AttributeSpecSyntax::setChild
          (AttributeSpecSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  EqualsValueClauseSyntax *pEVar2;
  long in_RSI;
  long in_RDI;
  Token TVar3;
  ConstTokenOrSyntax *in_stack_ffffffffffffffc8;
  undefined8 local_20;
  undefined8 local_18;
  
  if (in_RSI == 0) {
    TVar3 = ConstTokenOrSyntax::token(in_stack_ffffffffffffffc8);
    local_20 = TVar3._0_8_;
    *(undefined8 *)(in_RDI + 0x18) = local_20;
    local_18 = TVar3.info;
    *(Info **)(in_RDI + 0x20) = local_18;
  }
  else {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x989daa);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pEVar2 = (EqualsValueClauseSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x989dba);
      pEVar2 = SyntaxNode::as<slang::syntax::EqualsValueClauseSyntax>(pSVar1);
    }
    *(EqualsValueClauseSyntax **)(in_RDI + 0x28) = pEVar2;
  }
  return;
}

Assistant:

void AttributeSpecSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: name = child.token(); return;
        case 1: value = child.node() ? &child.node()->as<EqualsValueClauseSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}